

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteInitCursor(unqlite *pDb,unqlite_kv_cursor **ppOut)

{
  unqlite_kv_methods *puVar1;
  unqlite_kv_cursor *pSrc;
  sxu32 local_34;
  sxu32 nByte;
  unqlite_kv_cursor *pCur;
  unqlite_kv_methods *pMethods;
  unqlite_kv_cursor **ppOut_local;
  unqlite *pDb_local;
  
  puVar1 = ((pDb->sDB).pPager)->pEngine->pIo->pMethods;
  if (puVar1->szCursor < 1) {
    unqliteGenErrorFormat(pDb,"Storage engine \'%s\' does not support cursors",puVar1->zName);
    pDb_local._4_4_ = -0x11;
  }
  else {
    local_34 = puVar1->szCursor;
    if (local_34 < 8) {
      local_34 = local_34 + 8;
    }
    pSrc = (unqlite_kv_cursor *)SyMemBackendPoolAlloc(&pDb->sMem,local_34);
    if (pSrc == (unqlite_kv_cursor *)0x0) {
      unqliteGenOutofMem(pDb);
      pDb_local._4_4_ = -1;
    }
    else {
      SyZero(pSrc,local_34);
      pSrc->pStore = ((pDb->sDB).pPager)->pEngine;
      if (puVar1->xCursorInit != (_func_void_unqlite_kv_cursor_ptr *)0x0) {
        (*puVar1->xCursorInit)(pSrc);
      }
      *ppOut = pSrc;
      pDb_local._4_4_ = 0;
    }
  }
  return pDb_local._4_4_;
}

Assistant:

UNQLITE_PRIVATE int unqliteInitCursor(unqlite *pDb,unqlite_kv_cursor **ppOut)
{
	unqlite_kv_methods *pMethods;
	unqlite_kv_cursor *pCur;
	sxu32 nByte;
	/* Storage engine methods */
	pMethods = pDb->sDB.pPager->pEngine->pIo->pMethods;
	if( pMethods->szCursor < 1 ){
		/* Implementation does not supprt cursors */
		unqliteGenErrorFormat(pDb,"Storage engine '%s' does not support cursors",pMethods->zName);
		return UNQLITE_NOTIMPLEMENTED;
	}
	nByte = pMethods->szCursor;
	if( nByte < sizeof(unqlite_kv_cursor) ){
		nByte += sizeof(unqlite_kv_cursor);
	}
	pCur = (unqlite_kv_cursor *)SyMemBackendPoolAlloc(&pDb->sMem,nByte);
	if( pCur == 0 ){
		unqliteGenOutofMem(pDb);
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pCur,nByte);
	/* Save the cursor */
	pCur->pStore = pDb->sDB.pPager->pEngine;
	/* Invoke the initialization callback if any */
	if( pMethods->xCursorInit ){
		pMethods->xCursorInit(pCur);
	}
	/* All done */
	*ppOut = pCur;
	return UNQLITE_OK;
}